

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cc
# Opt level: O2

void __thiscall
gimage::BasicImageIO::load(BasicImageIO *this,ImageU8 *image,uint8 *data,size_t length)

{
  IOException *this_00;
  allocator local_39;
  string local_38;
  
  this_00 = (IOException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)&local_38,"Loading from memory is not implemented",&local_39);
  gutil::IOException::IOException(this_00,&local_38);
  __cxa_throw(this_00,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
}

Assistant:

void BasicImageIO::load(ImageU8 &image, gutil::uint8 *data, size_t length) const
{
  throw gutil::IOException("Loading from memory is not implemented");
}